

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O2

int run_test_udp_open(void)

{
  int iVar1;
  uv_os_sock_t uVar2;
  undefined8 uVar3;
  uv_loop_t *loop;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b_1;
  int64_t eval_b_6;
  uv_buf_t buf;
  sockaddr_in addr;
  uv_udp_t client2;
  uv_udp_t client;
  
  buf = (uv_buf_t)uv_buf_init("PING",4);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  eval_b_1 = (int64_t)iVar1;
  client2.data = (void *)0x0;
  client.data = (void *)eval_b_1;
  if ((void *)eval_b_1 == (void *)0x0) {
    uVar2 = create_udp_socket();
    uVar3 = uv_default_loop();
    iVar1 = uv_udp_init(uVar3,&client);
    client2.data = (void *)(long)iVar1;
    if (client2.data == (void *)0x0) {
      iVar1 = uv_udp_open(&client,uVar2);
      client2.data = (void *)(long)iVar1;
      if (client2.data == (void *)0x0) {
        iVar1 = uv_udp_bind(&client,&addr,0);
        client2.data = (void *)(long)iVar1;
        if (client2.data == (void *)0x0) {
          iVar1 = uv_udp_recv_start(&client,alloc_cb,recv_cb);
          client2.data = (void *)(long)iVar1;
          if (client2.data == (void *)0x0) {
            iVar1 = uv_udp_send(&send_req,&client,&buf,1,&addr,send_cb);
            client2.data = (void *)(long)iVar1;
            if (client2.data == (void *)0x0) {
              uVar3 = uv_default_loop();
              iVar1 = uv_udp_init(uVar3,&client2);
              eval_b_1 = (int64_t)iVar1;
              eval_b_6 = 0;
              if ((void *)eval_b_1 == (void *)0x0) {
                iVar1 = uv_udp_open(&client2,uVar2);
                eval_b_1 = (int64_t)iVar1;
                eval_b_6 = -0x11;
                if ((void *)eval_b_1 == (void *)0xffffffffffffffef) {
                  uv_close(&client2,0);
                  uVar3 = uv_default_loop();
                  uv_run(uVar3,0);
                  eval_b_1 = 1;
                  eval_b_6 = (int64_t)send_cb_called;
                  if (eval_b_6 == 1) {
                    eval_b_1 = 1;
                    eval_b_6 = (int64_t)close_cb_called;
                    if (eval_b_6 == 1) {
                      eval_b_6 = 0;
                      if (client.send_queue_size == 0) {
                        loop = (uv_loop_t *)uv_default_loop();
                        close_loop(loop);
                        eval_b_1 = 0;
                        uVar3 = uv_default_loop();
                        iVar1 = uv_loop_close(uVar3);
                        eval_b_6 = (int64_t)iVar1;
                        if (eval_b_6 == 0) {
                          uv_library_shutdown();
                          return 0;
                        }
                        pcVar5 = "uv_loop_close(uv_default_loop())";
                        pcVar4 = "0";
                        uVar3 = 0xbf;
                      }
                      else {
                        pcVar5 = "0";
                        pcVar4 = "client.send_queue_size";
                        uVar3 = 0xbd;
                        eval_b_1 = client.send_queue_size;
                      }
                    }
                    else {
                      pcVar5 = "close_cb_called";
                      pcVar4 = "1";
                      uVar3 = 0xbb;
                    }
                  }
                  else {
                    pcVar5 = "send_cb_called";
                    pcVar4 = "1";
                    uVar3 = 0xba;
                  }
                }
                else {
                  pcVar5 = "UV_EEXIST";
                  pcVar4 = "r";
                  uVar3 = 0xb0;
                }
              }
              else {
                pcVar5 = "0";
                pcVar4 = "r";
                uVar3 = 0xad;
              }
              goto LAB_001aa005;
            }
            uVar3 = 0xa8;
          }
          else {
            uVar3 = 0xa0;
          }
        }
        else {
          uVar3 = 0x9d;
        }
      }
      else {
        uVar3 = 0x9a;
      }
    }
    else {
      uVar3 = 0x97;
    }
    pcVar5 = "0";
    pcVar4 = "r";
    eval_b_6 = 0;
    eval_b_1 = (int64_t)client2.data;
  }
  else {
    pcVar5 = "0";
    pcVar4 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
    uVar3 = 0x91;
    eval_b_6 = 0;
  }
LAB_001aa005:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-open.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_b_1,"==",eval_b_6);
  abort();
}

Assistant:

TEST_IMPL(udp_open) {
  struct sockaddr_in addr;
  uv_buf_t buf = uv_buf_init("PING", 4);
  uv_udp_t client, client2;
  uv_os_sock_t sock;
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  startup();
  sock = create_udp_socket();

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  r = uv_udp_open(&client, sock);
  ASSERT_OK(r);

  r = uv_udp_bind(&client, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_udp_recv_start(&client, alloc_cb, recv_cb);
  ASSERT_OK(r);

  r = uv_udp_send(&send_req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT_OK(r);

#ifndef _WIN32
  {
    r = uv_udp_init(uv_default_loop(), &client2);
    ASSERT_OK(r);

    r = uv_udp_open(&client2, sock);
    ASSERT_EQ(r, UV_EEXIST);

    uv_close((uv_handle_t*) &client2, NULL);
  }
#else  /* _WIN32 */
  (void)client2;
#endif

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, send_cb_called);
  ASSERT_EQ(1, close_cb_called);

  ASSERT_OK(client.send_queue_size);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}